

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iir_filter.hpp
# Opt level: O2

void __thiscall IIR_I::filter(IIR_I *this,double *data_in,double *data_out,int len)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  
  pdVar3 = this->m_py;
  pdVar3[1] = 1.0;
  pdVar4 = this->m_px;
  uVar1 = this->m_num_order;
  uVar2 = this->m_den_order;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  uVar6 = (ulong)(uint)len;
  if (len < 1) {
    uVar6 = uVar8;
  }
  for (; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    *pdVar4 = data_in[uVar8];
    *pdVar3 = 0.0;
    pdVar5 = this->m_pNum;
    dVar12 = 0.0;
    for (lVar9 = 0; lVar9 <= (int)uVar1; lVar9 = lVar9 + 1) {
      dVar12 = dVar12 + pdVar5[lVar9] * pdVar4[lVar9];
      *pdVar3 = dVar12;
    }
    pdVar5 = this->m_pDen;
    for (uVar10 = 0; uVar11 = (ulong)uVar1, uVar7 != uVar10; uVar10 = uVar10 + 1) {
      dVar12 = dVar12 - pdVar5[uVar10 + 1] * pdVar3[uVar10 + 1];
      *pdVar3 = dVar12;
    }
    for (; uVar10 = (ulong)uVar2, 0 < (int)uVar11; uVar11 = uVar11 - 1) {
      pdVar4[uVar11] = pdVar4[uVar11 - 1];
    }
    for (; 0 < (int)uVar10; uVar10 = uVar10 - 1) {
      pdVar3[uVar10] = pdVar3[uVar10 - 1];
    }
    data_out[uVar8] = *pdVar3;
  }
  return;
}

Assistant:

void IIR_I::filter(double data_in[], double data_out[], int len)
{
    int i, k;
    m_py[1] = 1; //修改的地方，因为公式中y[n-k]，当为第一个元素时会出现y[-1]，pcen中y[-1]会被认为为1。
    for(k = 0; k < len; k++)
    {
        m_px[0] = data_in[k];
        m_py[0] = 0.0;
        for(i = 0; i <= m_num_order; i++)
        {
            m_py[0] = m_py[0] + m_pNum[i] * m_px[i];
        }
        for(i = 1; i <= m_den_order; i++)
        {
            m_py[0] = m_py[0] - m_pDen[i] * m_py[i];
        }
        for(i = m_num_order; i >= 1; i--)
        {
            m_px[i] = m_px[i-1];
        }
        for(i = m_den_order; i >= 1; i--)
        {
            m_py[i] = m_py[i-1];
        }
        data_out[k] = m_py[0];
    }
}